

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O1

string * __thiscall
absl::lts_20250127::int128::ToString_abi_cxx11_(string *__return_storage_ptr__,int128 *this)

{
  uint64_t uVar1;
  void *this_00;
  fmtflags in_R8D;
  bool bVar2;
  uint128 v;
  string local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (*(long *)((long)&this->v_ + 8) < 0) {
    in_R8D = _S_boolalpha;
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x4b35b5);
  }
  this_00 = *(void **)&this->v_;
  uVar1 = *(uint64_t *)((long)&this->v_ + 8);
  if ((long)uVar1 < 0) {
    bVar2 = this_00 != (void *)0x0;
    this_00 = (void *)-(long)this_00;
    uVar1 = -(ulong)bVar2 - uVar1;
  }
  v.hi_ = 2;
  v.lo_ = uVar1;
  lts_20250127::(anonymous_namespace)::Uint128ToFormattedString_abi_cxx11_
            (&local_38,this_00,v,in_R8D);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_38._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string int128::ToString() const {
  std::string rep;
  if (Int128High64(*this) < 0) rep = "-";
  rep.append(Uint128ToFormattedString(UnsignedAbsoluteValue(*this),
                                      std::ios_base::dec));
  return rep;
}